

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall
CMU462::DynamicScene::Scene::Scene
          (Scene *this,
          vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
          *_objects,
          vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
          *_lights)

{
  _Rb_tree_header *p_Var1;
  XFormWidget *this_00;
  long lVar2;
  pointer ppSVar3;
  pointer ppSVar4;
  ulong uVar5;
  
  (this->hovered).coordinates.x = 0.0;
  (this->hovered).coordinates.y = 0.0;
  (this->hovered).object = (SceneObject *)0x0;
  (this->hovered).element = (HalfedgeElement *)0x0;
  (this->hovered).coordinates.z = 0.0;
  (this->hovered).axis = None;
  (this->selected).object = (SceneObject *)0x0;
  (this->selected).element = (HalfedgeElement *)0x0;
  (this->selected).coordinates.x = 0.0;
  (this->selected).coordinates.y = 0.0;
  (this->selected).coordinates.z = 0.0;
  (this->selected).axis = None;
  (this->edited).object = (SceneObject *)0x0;
  (this->edited).element = (HalfedgeElement *)0x0;
  (this->edited).coordinates.x = 0.0;
  (this->edited).coordinates.y = 0.0;
  (this->edited).coordinates.z = 0.0;
  (this->edited).axis = None;
  p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->lights)._M_t._M_impl.super__Rb_tree_header;
  (this->lights)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lights)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lights)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lights)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->selectionInfo).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->selectionInfo).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lights)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->selectionInfo).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ppSVar3 = (_objects->
            super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((_objects->
      super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppSVar3) {
    lVar2 = 0;
    uVar5 = 0;
    do {
      *(Scene **)(*(long *)((long)ppSVar3 + lVar2) + 8) = this;
      std::
      _Rb_tree<CMU462::DynamicScene::SceneObject*,CMU462::DynamicScene::SceneObject*,std::_Identity<CMU462::DynamicScene::SceneObject*>,std::less<CMU462::DynamicScene::SceneObject*>,std::allocator<CMU462::DynamicScene::SceneObject*>>
      ::_M_insert_unique<CMU462::DynamicScene::SceneObject*const&>
                ((_Rb_tree<CMU462::DynamicScene::SceneObject*,CMU462::DynamicScene::SceneObject*,std::_Identity<CMU462::DynamicScene::SceneObject*>,std::less<CMU462::DynamicScene::SceneObject*>,std::allocator<CMU462::DynamicScene::SceneObject*>>
                  *)&this->objects,(SceneObject **)((long)ppSVar3 + lVar2));
      uVar5 = uVar5 + 1;
      ppSVar3 = (_objects->
                super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 8;
    } while (uVar5 < (ulong)((long)(_objects->
                                   super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3)
            );
  }
  ppSVar4 = (_lights->
            super__Vector_base<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((_lights->
      super__Vector_base<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppSVar4) {
    lVar2 = 0;
    uVar5 = 0;
    do {
      std::
      _Rb_tree<CMU462::DynamicScene::SceneLight*,CMU462::DynamicScene::SceneLight*,std::_Identity<CMU462::DynamicScene::SceneLight*>,std::less<CMU462::DynamicScene::SceneLight*>,std::allocator<CMU462::DynamicScene::SceneLight*>>
      ::_M_insert_unique<CMU462::DynamicScene::SceneLight*const&>
                ((_Rb_tree<CMU462::DynamicScene::SceneLight*,CMU462::DynamicScene::SceneLight*,std::_Identity<CMU462::DynamicScene::SceneLight*>,std::less<CMU462::DynamicScene::SceneLight*>,std::allocator<CMU462::DynamicScene::SceneLight*>>
                  *)&this->lights,(SceneLight **)((long)ppSVar4 + lVar2));
      uVar5 = uVar5 + 1;
      ppSVar4 = (_lights->
                super__Vector_base<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 8;
    } while (uVar5 < (ulong)((long)(_lights->
                                   super__Vector_base<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3)
            );
  }
  this_00 = (XFormWidget *)operator_new(0x218);
  XFormWidget::XFormWidget(this_00);
  this->elementTransform = this_00;
  return;
}

Assistant:

Scene::Scene(std::vector<SceneObject *> _objects,
             std::vector<SceneLight *> _lights) {
  for (int i = 0; i < _objects.size(); i++) {
    _objects[i]->scene = this;
    objects.insert(_objects[i]);
  }

  for (int i = 0; i < _lights.size(); i++) {
    lights.insert(_lights[i]);
  }

  elementTransform = new XFormWidget();
}